

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_or(lua_State *L)

{
  int iVar1;
  lua_Unsigned lVar2;
  undefined4 local_1c;
  b_uint r;
  int n;
  int i;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  local_1c = 0;
  for (r = 1; (int)r <= iVar1; r = r + 1) {
    lVar2 = luaL_checkunsigned(L,r);
    local_1c = lVar2 | local_1c;
  }
  lua_pushunsigned(L,local_1c);
  return 1;
}

Assistant:

static int b_or (lua_State *L) {
  int i, n = lua_gettop(L);
  b_uint r = 0;
  for (i = 1; i <= n; i++)
    r |= luaL_checkunsigned(L, i);
  lua_pushunsigned(L, trim(r));
  return 1;
}